

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * flatbuffers::cpp::CppGenerator::TranslateNameSpace
                   (string *__return_storage_ptr__,string *qualified_name)

{
  ulong uVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)qualified_name);
  while( true ) {
    uVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,(char *)0x1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string TranslateNameSpace(const std::string &qualified_name) {
    std::string cpp_qualified_name = qualified_name;
    size_t start_pos = 0;
    while ((start_pos = cpp_qualified_name.find('.', start_pos)) !=
           std::string::npos) {
      cpp_qualified_name.replace(start_pos, 1, "::");
    }
    return cpp_qualified_name;
  }